

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fluid.hpp
# Opt level: O0

void __thiscall Fluid::setup_grid_project(Fluid *this,float dt)

{
  PFNGLUNIFORM1FPROC p_Var1;
  PFNGLUNIFORM3FVPROC p_Var2;
  PFNGLUNIFORM3IVPROC p_Var3;
  GLint GVar4;
  float *pfVar5;
  int *piVar6;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  float local_14;
  Fluid *pFStack_10;
  float dt_local;
  Fluid *this_local;
  
  local_14 = dt;
  pFStack_10 = this;
  ssbo_barrier(this);
  gfx::Program::use(&this->setup_grid_project_program);
  p_Var1 = glad_glUniform1f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"dt",&local_39);
  GVar4 = gfx::Program::uniform_loc(&this->setup_grid_project_program,&local_38);
  (*p_Var1)(GVar4,local_14);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  p_Var2 = glad_glUniform3fv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"bounds_min",&local_71);
  GVar4 = gfx::Program::uniform_loc(&this->setup_grid_project_program,&local_70);
  pfVar5 = glm::value_ptr<float,(glm::qualifier)0>(&this->bounds_min);
  (*p_Var2)(GVar4,1,pfVar5);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  p_Var2 = glad_glUniform3fv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"bounds_max",&local_99);
  GVar4 = gfx::Program::uniform_loc(&this->setup_grid_project_program,&local_98);
  pfVar5 = glm::value_ptr<float,(glm::qualifier)0>(&this->bounds_max);
  (*p_Var2)(GVar4,1,pfVar5);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  p_Var3 = glad_glUniform3iv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"grid_dim",&local_c1);
  GVar4 = gfx::Program::uniform_loc(&this->setup_grid_project_program,&local_c0);
  piVar6 = glm::value_ptr<int,(glm::qualifier)0>(&this->grid_dimensions);
  (*p_Var3)(GVar4,1,piVar6);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  gfx::Program::validate(&this->setup_grid_project_program);
  (*glad_glDispatchCompute)
            ((this->grid_dimensions).field_0.x,(this->grid_dimensions).field_1.y,
             (this->grid_dimensions).field_2.z);
  gfx::Program::disuse(&this->setup_grid_project_program);
  return;
}

Assistant:

void setup_grid_project(float dt) {
        ssbo_barrier();
        setup_grid_project_program.use();
        glUniform1f(setup_grid_project_program.uniform_loc("dt"), dt);
        glUniform3fv(setup_grid_project_program.uniform_loc("bounds_min"), 1, glm::value_ptr(bounds_min));
        glUniform3fv(setup_grid_project_program.uniform_loc("bounds_max"), 1, glm::value_ptr(bounds_max));
        glUniform3iv(setup_grid_project_program.uniform_loc("grid_dim"), 1, glm::value_ptr(grid_dimensions));
        setup_grid_project_program.validate();
        glDispatchCompute(grid_dimensions.x, grid_dimensions.y, grid_dimensions.z);
        setup_grid_project_program.disuse();
    }